

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::NamedBase::NamedBase(NamedBase *this,string *name_,string *help_)

{
  string *in_RSI;
  Base *in_RDI;
  string *in_stack_ffffffffffffffc8;
  
  Base::Base(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_Base = (_func_int **)&PTR__NamedBase_00186970;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  in_RDI[1].help.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

NamedBase(const std::string &name_, const std::string &help_) : Base(help_), name(name_), kickout(false) {}